

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O3

int TransferToublox(UBLOX *publox,uchar *buf,int buflen)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = (publox->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    if (0 < buflen) {
      iVar1 = (publox->RS232Port).s;
      uVar4 = 0;
      do {
        sVar2 = send(iVar1,buf + uVar4,(long)(buflen - (int)uVar4),0);
        if ((int)sVar2 < 1) goto LAB_0012b852;
        uVar3 = (int)uVar4 + (int)sVar2;
        uVar4 = (ulong)uVar3;
      } while ((int)uVar3 < buflen);
    }
  }
  else {
    if (iVar1 != 0) {
LAB_0012b852:
      puts("Error writing data to a ublox. ");
      return 1;
    }
    if (buflen != 0) {
      iVar1 = *(int *)&(publox->RS232Port).hDev;
      uVar4 = 0;
      do {
        sVar2 = write(iVar1,buf + uVar4,(ulong)(uint)(buflen - (int)uVar4));
        if ((int)sVar2 < 1) goto LAB_0012b852;
        uVar3 = (int)uVar4 + (int)sVar2;
        uVar4 = (ulong)uVar3;
      } while (uVar3 < (uint)buflen);
    }
  }
  if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
    fwrite(buf,(long)buflen,1,(FILE *)publox->pfSaveFile);
    fflush((FILE *)publox->pfSaveFile);
  }
  return 0;
}

Assistant:

inline int TransferToublox(UBLOX* publox, unsigned char* buf, int buflen)
{
	if (WriteAllRS232Port(&publox->RS232Port, buf, buflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(buf, buflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	return EXIT_SUCCESS;
}